

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cc
# Opt level: O2

ostream * tchecker::dbm::output(ostream *os,db_t *db)

{
  ostream *this;
  db_t *in_RDX;
  string sStack_38;
  
  if (*db == (db_t)0x7ffffffe) {
    std::operator<<(os,"<inf");
  }
  else {
    comparator_str_abi_cxx11_(&sStack_38,(dbm *)db,in_RDX);
    this = std::operator<<(os,(string *)&sStack_38);
    std::ostream::operator<<((ostream *)this,(int)*db >> 1);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return os;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::dbm::db_t const & db)
{
  if (db == tchecker::dbm::LT_INFINITY)
    os << "<inf";
  else
    os << tchecker::dbm::comparator_str(db) << tchecker::dbm::value(db);
  return os;
}